

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersector1<8,_1048576,_false,_embree::avx::ArrayIntersector1<embree::avx::TriangleMIntersector1Moeller<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  long lVar1;
  long lVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ulong uVar7;
  byte *pbVar8;
  undefined1 auVar9 [32];
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  undefined1 auVar50 [16];
  uint uVar51;
  undefined1 auVar52 [4];
  ulong uVar53;
  ulong uVar54;
  ulong *puVar55;
  undefined1 (*pauVar56) [16];
  undefined4 uVar57;
  ulong uVar58;
  long lVar59;
  byte *pbVar60;
  ulong uVar61;
  long lVar62;
  undefined1 (*pauVar63) [16];
  ulong uVar64;
  ulong uVar65;
  ulong uVar66;
  ulong uVar67;
  float fVar68;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  float fVar77;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  float fVar75;
  float fVar76;
  undefined1 auVar74 [64];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [32];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [32];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [32];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  float fVar131;
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  uint uVar134;
  uint uVar135;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  uint uVar136;
  undefined1 auVar137 [64];
  undefined1 auVar138 [64];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [64];
  undefined1 auVar144 [64];
  undefined1 auVar145 [16];
  undefined1 auVar146 [64];
  undefined1 auVar147 [16];
  undefined1 auVar148 [64];
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_2690 [4];
  undefined1 auStack_268c [8];
  float fStack_2684;
  undefined8 local_2670;
  undefined8 uStack_2668;
  int local_2654;
  undefined1 local_2650 [16];
  undefined1 local_2640 [16];
  undefined1 local_2630 [16];
  long local_2618;
  ulong local_2610;
  RayQueryContext *local_2608;
  undefined1 local_2600 [16];
  undefined1 local_25f0 [16];
  long local_25d8;
  int *local_25d0;
  byte *local_25c8;
  RTCRayQueryContext *local_25c0;
  RayHit *local_25b8;
  float *local_25b0;
  undefined4 local_25a8;
  float local_25a0;
  undefined4 local_259c;
  undefined4 local_2598;
  float local_2594;
  float local_2590;
  undefined4 local_258c;
  uint local_2588;
  uint local_2584;
  uint local_2580;
  undefined1 local_2570 [16];
  undefined1 local_2560 [16];
  undefined8 local_2550;
  undefined8 uStack_2548;
  undefined1 local_2540 [32];
  undefined1 local_2520 [16];
  undefined1 local_2510 [16];
  undefined1 local_24f0 [16];
  float local_24e0 [4];
  float local_24d0 [4];
  undefined1 local_24c0 [16];
  float local_24b0 [4];
  undefined8 local_24a0;
  undefined8 uStack_2498;
  undefined8 local_2490;
  undefined8 uStack_2488;
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  long local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  
  local_23a0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_23a0 != 8) {
    pauVar63 = (undefined1 (*) [16])local_2390;
    uStack_2398 = 0;
    auVar78 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    auVar92 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
    aVar4 = (ray->super_RayK<1>).dir.field_0;
    auVar107._8_4_ = 0x7fffffff;
    auVar107._0_8_ = 0x7fffffff7fffffff;
    auVar107._12_4_ = 0x7fffffff;
    auVar107 = vandps_avx((undefined1  [16])aVar4,auVar107);
    auVar110._8_4_ = 0x219392ef;
    auVar110._0_8_ = 0x219392ef219392ef;
    auVar110._12_4_ = 0x219392ef;
    auVar107 = vcmpps_avx(auVar107,auVar110,1);
    auVar107 = vblendvps_avx((undefined1  [16])aVar4,auVar110,auVar107);
    auVar110 = vrcpps_avx(auVar107);
    fVar68 = auVar110._0_4_;
    auVar100._0_4_ = auVar107._0_4_ * fVar68;
    fVar75 = auVar110._4_4_;
    auVar100._4_4_ = auVar107._4_4_ * fVar75;
    fVar76 = auVar110._8_4_;
    auVar100._8_4_ = auVar107._8_4_ * fVar76;
    fVar77 = auVar110._12_4_;
    auVar100._12_4_ = auVar107._12_4_ * fVar77;
    auVar111._8_4_ = 0x3f800000;
    auVar111._0_8_ = 0x3f8000003f800000;
    auVar111._12_4_ = 0x3f800000;
    auVar107 = vsubps_avx(auVar111,auVar100);
    uVar57 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
    local_23e0._4_4_ = uVar57;
    local_23e0._0_4_ = uVar57;
    local_23e0._8_4_ = uVar57;
    local_23e0._12_4_ = uVar57;
    local_23e0._16_4_ = uVar57;
    local_23e0._20_4_ = uVar57;
    local_23e0._24_4_ = uVar57;
    local_23e0._28_4_ = uVar57;
    auVar137 = ZEXT3264(local_23e0);
    uVar57 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
    local_2400._4_4_ = uVar57;
    local_2400._0_4_ = uVar57;
    local_2400._8_4_ = uVar57;
    local_2400._12_4_ = uVar57;
    local_2400._16_4_ = uVar57;
    local_2400._20_4_ = uVar57;
    local_2400._24_4_ = uVar57;
    local_2400._28_4_ = uVar57;
    auVar138 = ZEXT3264(local_2400);
    auVar101._0_4_ = fVar68 + fVar68 * auVar107._0_4_;
    auVar101._4_4_ = fVar75 + fVar75 * auVar107._4_4_;
    auVar101._8_4_ = fVar76 + fVar76 * auVar107._8_4_;
    auVar101._12_4_ = fVar77 + fVar77 * auVar107._12_4_;
    uVar57 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
    local_2420._4_4_ = uVar57;
    local_2420._0_4_ = uVar57;
    local_2420._8_4_ = uVar57;
    local_2420._12_4_ = uVar57;
    local_2420._16_4_ = uVar57;
    local_2420._20_4_ = uVar57;
    local_2420._24_4_ = uVar57;
    local_2420._28_4_ = uVar57;
    auVar143 = ZEXT3264(local_2420);
    auVar107 = vshufps_avx(auVar101,auVar101,0);
    local_2440._16_16_ = auVar107;
    local_2440._0_16_ = auVar107;
    auVar144 = ZEXT3264(local_2440);
    auVar107 = vmovshdup_avx(auVar101);
    auVar110 = vshufps_avx(auVar101,auVar101,0x55);
    local_2460._16_16_ = auVar110;
    local_2460._0_16_ = auVar110;
    auVar146 = ZEXT3264(local_2460);
    auVar110 = vshufpd_avx(auVar101,auVar101,1);
    auVar100 = vshufps_avx(auVar101,auVar101,0xaa);
    local_2480._16_16_ = auVar100;
    local_2480._0_16_ = auVar100;
    auVar148 = ZEXT3264(local_2480);
    uVar64 = (ulong)(auVar101._0_4_ < 0.0) << 3;
    uVar53 = (ulong)(auVar107._0_4_ < 0.0);
    lVar1 = uVar53 * 8;
    uVar54 = (ulong)(auVar110._0_4_ < 0.0);
    lVar2 = uVar54 * 8;
    auVar107 = vshufps_avx(auVar78,auVar78,0);
    local_23c0._16_16_ = auVar107;
    local_23c0._0_16_ = auVar107;
    auVar107 = vshufps_avx(auVar92,auVar92,0);
    auVar74 = ZEXT3264(CONCAT1616(auVar107,auVar107));
    uVar65 = uVar64 ^ 8;
    uVar67 = lVar1 + 0x10U ^ 8;
    uVar61 = lVar2 + 0x20U ^ 8;
    local_2550 = mm_lookupmask_ps._240_8_;
    uStack_2548 = mm_lookupmask_ps._248_8_;
LAB_00e7478e:
    if (pauVar63 != (undefined1 (*) [16])&local_23a0) {
      pauVar56 = pauVar63 + -1;
      pauVar63 = pauVar63 + -1;
      if (*(float *)(*pauVar56 + 8) <= (ray->super_RayK<1>).tfar) {
        uVar58 = *(ulong *)*pauVar63;
        while ((uVar58 & 8) == 0) {
          uVar66 = uVar58 & 0xfffffffffffffff0;
          puVar55 = (ulong *)(uVar66 + 0x40);
          if (uVar66 == 0) {
            puVar55 = (ulong *)0x0;
          }
          auVar78._8_8_ = 0;
          auVar78._0_8_ = *puVar55;
          auVar102._8_8_ = 0;
          auVar102._0_8_ = puVar55[1];
          auVar107 = vpminub_avx(auVar78,auVar102);
          auVar107 = vpcmpeqb_avx(auVar78,auVar107);
          auVar92._8_8_ = 0;
          auVar92._0_8_ = *(ulong *)((long)puVar55 + 4);
          auVar108._8_8_ = 0;
          auVar108._0_8_ = *(ulong *)((long)puVar55 + 0xc);
          auVar78 = vpminub_avx(auVar92,auVar108);
          auVar78 = vpcmpeqb_avx(auVar92,auVar78);
          fVar68 = *(float *)(puVar55 + 6);
          fVar75 = *(float *)((long)puVar55 + 0x3c);
          auVar103._8_8_ = 0;
          auVar103._0_8_ = *(ulong *)((long)puVar55 + uVar64);
          auVar92 = vpmovzxbd_avx(auVar103);
          auVar116._8_8_ = 0;
          auVar116._0_8_ = *(ulong *)((long)puVar55 + uVar64 + 4);
          auVar110 = vpmovzxbd_avx(auVar116);
          auVar105._16_16_ = auVar110;
          auVar105._0_16_ = auVar92;
          auVar105 = vcvtdq2ps_avx(auVar105);
          auVar106._0_4_ = fVar68 + fVar75 * auVar105._0_4_;
          auVar106._4_4_ = fVar68 + fVar75 * auVar105._4_4_;
          auVar106._8_4_ = fVar68 + fVar75 * auVar105._8_4_;
          auVar106._12_4_ = fVar68 + fVar75 * auVar105._12_4_;
          auVar106._16_4_ = fVar68 + fVar75 * auVar105._16_4_;
          auVar106._20_4_ = fVar68 + fVar75 * auVar105._20_4_;
          auVar106._24_4_ = fVar68 + fVar75 * auVar105._24_4_;
          auVar106._28_4_ = fVar68 + auVar105._28_4_;
          auVar117._8_8_ = 0;
          auVar117._0_8_ = *(ulong *)((long)puVar55 + uVar65);
          auVar92 = vpmovzxbd_avx(auVar117);
          auVar120._8_8_ = 0;
          auVar120._0_8_ = *(ulong *)((long)puVar55 + uVar65 + 4);
          auVar110 = vpmovzxbd_avx(auVar120);
          auVar118._16_16_ = auVar110;
          auVar118._0_16_ = auVar92;
          auVar105 = vcvtdq2ps_avx(auVar118);
          auVar109._0_4_ = fVar68 + fVar75 * auVar105._0_4_;
          auVar109._4_4_ = fVar68 + fVar75 * auVar105._4_4_;
          auVar109._8_4_ = fVar68 + fVar75 * auVar105._8_4_;
          auVar109._12_4_ = fVar68 + fVar75 * auVar105._12_4_;
          auVar109._16_4_ = fVar68 + fVar75 * auVar105._16_4_;
          auVar109._20_4_ = fVar68 + fVar75 * auVar105._20_4_;
          auVar109._24_4_ = fVar68 + fVar75 * auVar105._24_4_;
          auVar109._28_4_ = fVar68 + fVar75;
          fVar68 = *(float *)((long)puVar55 + 0x34);
          fVar75 = *(float *)(puVar55 + 8);
          auVar112._8_8_ = 0;
          auVar112._0_8_ = puVar55[uVar53 + 2];
          auVar92 = vpmovzxbd_avx(auVar112);
          auVar124._8_8_ = 0;
          auVar124._0_8_ = *(ulong *)((long)puVar55 + lVar1 + 0x14);
          auVar110 = vpmovzxbd_avx(auVar124);
          auVar114._16_16_ = auVar110;
          auVar114._0_16_ = auVar92;
          auVar105 = vcvtdq2ps_avx(auVar114);
          auVar115._0_4_ = fVar68 + fVar75 * auVar105._0_4_;
          auVar115._4_4_ = fVar68 + fVar75 * auVar105._4_4_;
          auVar115._8_4_ = fVar68 + fVar75 * auVar105._8_4_;
          auVar115._12_4_ = fVar68 + fVar75 * auVar105._12_4_;
          auVar115._16_4_ = fVar68 + fVar75 * auVar105._16_4_;
          auVar115._20_4_ = fVar68 + fVar75 * auVar105._20_4_;
          auVar115._24_4_ = fVar68 + fVar75 * auVar105._24_4_;
          auVar115._28_4_ = fVar68 + auVar105._28_4_;
          auVar125._8_8_ = 0;
          auVar125._0_8_ = *(ulong *)((long)puVar55 + uVar67);
          auVar92 = vpmovzxbd_avx(auVar125);
          auVar132._8_8_ = 0;
          auVar132._0_8_ = *(ulong *)((long)puVar55 + uVar67 + 4);
          auVar110 = vpmovzxbd_avx(auVar132);
          auVar128._16_16_ = auVar110;
          auVar128._0_16_ = auVar92;
          auVar105 = vcvtdq2ps_avx(auVar128);
          auVar119._0_4_ = fVar68 + auVar105._0_4_ * fVar75;
          auVar119._4_4_ = fVar68 + auVar105._4_4_ * fVar75;
          auVar119._8_4_ = fVar68 + auVar105._8_4_ * fVar75;
          auVar119._12_4_ = fVar68 + auVar105._12_4_ * fVar75;
          auVar119._16_4_ = fVar68 + auVar105._16_4_ * fVar75;
          auVar119._20_4_ = fVar68 + auVar105._20_4_ * fVar75;
          auVar119._24_4_ = fVar68 + auVar105._24_4_ * fVar75;
          auVar119._28_4_ = fVar68 + fVar75;
          auVar121._8_8_ = 0;
          auVar121._0_8_ = puVar55[uVar54 + 4];
          auVar92 = vpmovzxbd_avx(auVar121);
          auVar126._8_8_ = 0;
          auVar126._0_8_ = *(ulong *)((long)puVar55 + lVar2 + 0x24);
          auVar110 = vpmovzxbd_avx(auVar126);
          auVar122._16_16_ = auVar110;
          auVar122._0_16_ = auVar92;
          auVar127._8_8_ = 0;
          auVar127._0_8_ = *(ulong *)((long)puVar55 + uVar61);
          auVar92 = vpmovzxbd_avx(auVar127);
          auVar133._8_8_ = 0;
          auVar133._0_8_ = *(ulong *)((long)puVar55 + uVar61 + 4);
          auVar110 = vpmovzxbd_avx(auVar133);
          auVar129._16_16_ = auVar110;
          auVar129._0_16_ = auVar92;
          fVar68 = *(float *)((long)puVar55 + 0x44);
          auVar105 = vcvtdq2ps_avx(auVar122);
          auVar9 = vcvtdq2ps_avx(auVar129);
          fVar75 = *(float *)(puVar55 + 7);
          auVar123._0_4_ = fVar75 + fVar68 * auVar105._0_4_;
          auVar123._4_4_ = fVar75 + fVar68 * auVar105._4_4_;
          auVar123._8_4_ = fVar75 + fVar68 * auVar105._8_4_;
          auVar123._12_4_ = fVar75 + fVar68 * auVar105._12_4_;
          auVar123._16_4_ = fVar75 + fVar68 * auVar105._16_4_;
          auVar123._20_4_ = fVar75 + fVar68 * auVar105._20_4_;
          auVar123._24_4_ = fVar75 + fVar68 * auVar105._24_4_;
          auVar123._28_4_ = fVar75 + auVar105._28_4_;
          auVar130._0_4_ = fVar75 + fVar68 * auVar9._0_4_;
          auVar130._4_4_ = fVar75 + fVar68 * auVar9._4_4_;
          auVar130._8_4_ = fVar75 + fVar68 * auVar9._8_4_;
          auVar130._12_4_ = fVar75 + fVar68 * auVar9._12_4_;
          auVar130._16_4_ = fVar75 + fVar68 * auVar9._16_4_;
          auVar130._20_4_ = fVar75 + fVar68 * auVar9._20_4_;
          auVar130._24_4_ = fVar75 + fVar68 * auVar9._24_4_;
          auVar130._28_4_ = fVar75 + auVar9._28_4_;
          auVar105 = vsubps_avx(auVar106,auVar137._0_32_);
          auVar9._4_4_ = auVar144._4_4_ * auVar105._4_4_;
          auVar9._0_4_ = auVar144._0_4_ * auVar105._0_4_;
          auVar9._8_4_ = auVar144._8_4_ * auVar105._8_4_;
          auVar9._12_4_ = auVar144._12_4_ * auVar105._12_4_;
          auVar9._16_4_ = auVar144._16_4_ * auVar105._16_4_;
          auVar9._20_4_ = auVar144._20_4_ * auVar105._20_4_;
          auVar9._24_4_ = auVar144._24_4_ * auVar105._24_4_;
          auVar9._28_4_ = auVar105._28_4_;
          auVar105 = vsubps_avx(auVar115,auVar138._0_32_);
          auVar21._4_4_ = auVar146._4_4_ * auVar105._4_4_;
          auVar21._0_4_ = auVar146._0_4_ * auVar105._0_4_;
          auVar21._8_4_ = auVar146._8_4_ * auVar105._8_4_;
          auVar21._12_4_ = auVar146._12_4_ * auVar105._12_4_;
          auVar21._16_4_ = auVar146._16_4_ * auVar105._16_4_;
          auVar21._20_4_ = auVar146._20_4_ * auVar105._20_4_;
          auVar21._24_4_ = auVar146._24_4_ * auVar105._24_4_;
          auVar21._28_4_ = auVar105._28_4_;
          auVar105 = vmaxps_avx(auVar9,auVar21);
          auVar9 = vsubps_avx(auVar123,auVar143._0_32_);
          auVar22._4_4_ = auVar148._4_4_ * auVar9._4_4_;
          auVar22._0_4_ = auVar148._0_4_ * auVar9._0_4_;
          auVar22._8_4_ = auVar148._8_4_ * auVar9._8_4_;
          auVar22._12_4_ = auVar148._12_4_ * auVar9._12_4_;
          auVar22._16_4_ = auVar148._16_4_ * auVar9._16_4_;
          auVar22._20_4_ = auVar148._20_4_ * auVar9._20_4_;
          auVar22._24_4_ = auVar148._24_4_ * auVar9._24_4_;
          auVar22._28_4_ = auVar9._28_4_;
          auVar9 = vmaxps_avx(auVar22,local_23c0);
          local_2540 = vmaxps_avx(auVar105,auVar9);
          auVar105 = vsubps_avx(auVar109,auVar137._0_32_);
          auVar23._4_4_ = auVar144._4_4_ * auVar105._4_4_;
          auVar23._0_4_ = auVar144._0_4_ * auVar105._0_4_;
          auVar23._8_4_ = auVar144._8_4_ * auVar105._8_4_;
          auVar23._12_4_ = auVar144._12_4_ * auVar105._12_4_;
          auVar23._16_4_ = auVar144._16_4_ * auVar105._16_4_;
          auVar23._20_4_ = auVar144._20_4_ * auVar105._20_4_;
          auVar23._24_4_ = auVar144._24_4_ * auVar105._24_4_;
          auVar23._28_4_ = auVar105._28_4_;
          auVar105 = vsubps_avx(auVar119,auVar138._0_32_);
          auVar24._4_4_ = auVar146._4_4_ * auVar105._4_4_;
          auVar24._0_4_ = auVar146._0_4_ * auVar105._0_4_;
          auVar24._8_4_ = auVar146._8_4_ * auVar105._8_4_;
          auVar24._12_4_ = auVar146._12_4_ * auVar105._12_4_;
          auVar24._16_4_ = auVar146._16_4_ * auVar105._16_4_;
          auVar24._20_4_ = auVar146._20_4_ * auVar105._20_4_;
          auVar24._24_4_ = auVar146._24_4_ * auVar105._24_4_;
          auVar24._28_4_ = auVar105._28_4_;
          auVar105 = vminps_avx(auVar23,auVar24);
          auVar9 = vsubps_avx(auVar130,auVar143._0_32_);
          auVar25._4_4_ = auVar148._4_4_ * auVar9._4_4_;
          auVar25._0_4_ = auVar148._0_4_ * auVar9._0_4_;
          auVar25._8_4_ = auVar148._8_4_ * auVar9._8_4_;
          auVar25._12_4_ = auVar148._12_4_ * auVar9._12_4_;
          auVar25._16_4_ = auVar148._16_4_ * auVar9._16_4_;
          auVar25._20_4_ = auVar148._20_4_ * auVar9._20_4_;
          auVar25._24_4_ = auVar148._24_4_ * auVar9._24_4_;
          auVar25._28_4_ = auVar9._28_4_;
          auVar9 = vminps_avx(auVar25,auVar74._0_32_);
          auVar9 = vminps_avx(auVar105,auVar9);
          auVar105 = vcmpps_avx(local_2540,auVar9,2);
          auVar92 = vpcmpeqd_avx(auVar9._0_16_,auVar9._0_16_);
          auVar107 = vpmovsxbd_avx(auVar107 ^ auVar92);
          auVar78 = vpmovsxbd_avx(auVar78 ^ auVar92);
          auVar91._16_16_ = auVar78;
          auVar91._0_16_ = auVar107;
          auVar9 = vcvtdq2ps_avx(auVar91);
          auVar99._8_4_ = 0xbf800000;
          auVar99._0_8_ = 0xbf800000bf800000;
          auVar99._12_4_ = 0xbf800000;
          auVar99._16_4_ = 0xbf800000;
          auVar99._20_4_ = 0xbf800000;
          auVar99._24_4_ = 0xbf800000;
          auVar99._28_4_ = 0xbf800000;
          auVar9 = vcmpps_avx(auVar99,auVar9,1);
          auVar105 = vandps_avx(auVar105,auVar9);
          uVar51 = vmovmskps_avx(auVar105);
          if (uVar51 == 0) goto LAB_00e7478e;
          uVar51 = uVar51 & 0xff;
          lVar59 = 0;
          if (uVar51 != 0) {
            for (; (uVar51 >> lVar59 & 1) == 0; lVar59 = lVar59 + 1) {
            }
          }
          uVar58 = *(ulong *)(uVar66 + lVar59 * 8);
          uVar51 = uVar51 - 1 & uVar51;
          if (uVar51 != 0) {
            _local_2690 = pauVar63;
            uVar134 = *(uint *)(local_2540 + lVar59 * 4);
            lVar59 = 0;
            if (uVar51 != 0) {
              for (; (uVar51 >> lVar59 & 1) == 0; lVar59 = lVar59 + 1) {
              }
            }
            uVar7 = *(ulong *)(uVar66 + lVar59 * 8);
            uVar135 = *(uint *)(local_2540 + lVar59 * 4);
            uVar51 = uVar51 - 1 & uVar51;
            if (uVar51 == 0) {
              if (uVar134 < uVar135) {
                *(ulong *)*pauVar63 = uVar7;
                *(uint *)(*pauVar63 + 8) = uVar135;
                pauVar63 = pauVar63 + 1;
              }
              else {
                *(ulong *)*pauVar63 = uVar58;
                *(uint *)(*pauVar63 + 8) = uVar134;
                pauVar63 = pauVar63 + 1;
                uVar58 = uVar7;
              }
            }
            else {
              auVar79._8_8_ = 0;
              auVar79._0_8_ = uVar58;
              auVar107 = vpunpcklqdq_avx(auVar79,ZEXT416(uVar134));
              auVar93._8_8_ = 0;
              auVar93._0_8_ = uVar7;
              auVar78 = vpunpcklqdq_avx(auVar93,ZEXT416(uVar135));
              lVar59 = 0;
              if (uVar51 != 0) {
                for (; (uVar51 >> lVar59 & 1) == 0; lVar59 = lVar59 + 1) {
                }
              }
              auVar104._8_8_ = 0;
              auVar104._0_8_ = *(ulong *)(uVar66 + lVar59 * 8);
              auVar110 = vpunpcklqdq_avx(auVar104,ZEXT416(*(uint *)(local_2540 + lVar59 * 4)));
              auVar92 = vpcmpgtd_avx(auVar78,auVar107);
              uVar51 = uVar51 - 1 & uVar51;
              if (uVar51 == 0) {
                auVar100 = vpshufd_avx(auVar92,0xaa);
                auVar92 = vblendvps_avx(auVar78,auVar107,auVar100);
                auVar107 = vblendvps_avx(auVar107,auVar78,auVar100);
                auVar78 = vpcmpgtd_avx(auVar110,auVar92);
                auVar100 = vpshufd_avx(auVar78,0xaa);
                auVar78 = vblendvps_avx(auVar110,auVar92,auVar100);
                auVar92 = vblendvps_avx(auVar92,auVar110,auVar100);
                auVar110 = vpcmpgtd_avx(auVar92,auVar107);
                auVar100 = vpshufd_avx(auVar110,0xaa);
                auVar110 = vblendvps_avx(auVar92,auVar107,auVar100);
                auVar107 = vblendvps_avx(auVar107,auVar92,auVar100);
                *pauVar63 = auVar107;
                pauVar63[1] = auVar110;
                uVar58 = auVar78._0_8_;
                pauVar63 = pauVar63 + 2;
              }
              else {
                lVar59 = 0;
                if (uVar51 != 0) {
                  for (; (uVar51 >> lVar59 & 1) == 0; lVar59 = lVar59 + 1) {
                  }
                }
                auVar113._8_8_ = 0;
                auVar113._0_8_ = *(ulong *)(uVar66 + lVar59 * 8);
                auVar100 = vpunpcklqdq_avx(auVar113,ZEXT416(*(uint *)(local_2540 + lVar59 * 4)));
                uVar51 = uVar51 - 1 & uVar51;
                uVar58 = (ulong)uVar51;
                if (uVar51 == 0) {
                  auVar101 = vpshufd_avx(auVar92,0xaa);
                  auVar92 = vblendvps_avx(auVar78,auVar107,auVar101);
                  auVar107 = vblendvps_avx(auVar107,auVar78,auVar101);
                  auVar78 = vpcmpgtd_avx(auVar100,auVar110);
                  auVar101 = vpshufd_avx(auVar78,0xaa);
                  auVar78 = vblendvps_avx(auVar100,auVar110,auVar101);
                  auVar110 = vblendvps_avx(auVar110,auVar100,auVar101);
                  auVar100 = vpcmpgtd_avx(auVar110,auVar107);
                  auVar101 = vpshufd_avx(auVar100,0xaa);
                  auVar100 = vblendvps_avx(auVar110,auVar107,auVar101);
                  auVar107 = vblendvps_avx(auVar107,auVar110,auVar101);
                  auVar110 = vpcmpgtd_avx(auVar78,auVar92);
                  auVar101 = vpshufd_avx(auVar110,0xaa);
                  auVar110 = vblendvps_avx(auVar78,auVar92,auVar101);
                  auVar78 = vblendvps_avx(auVar92,auVar78,auVar101);
                  auVar92 = vpcmpgtd_avx(auVar100,auVar78);
                  auVar101 = vpshufd_avx(auVar92,0xaa);
                  auVar92 = vblendvps_avx(auVar100,auVar78,auVar101);
                  auVar78 = vblendvps_avx(auVar78,auVar100,auVar101);
                  *pauVar63 = auVar107;
                  pauVar63[1] = auVar78;
                  pauVar63[2] = auVar92;
                  pauVar63 = pauVar63 + 3;
                  uVar58 = auVar110._0_8_;
                }
                else {
                  *pauVar63 = auVar107;
                  pauVar63[1] = auVar78;
                  pauVar63[2] = auVar110;
                  pauVar56 = pauVar63 + 3;
                  pauVar63[3] = auVar100;
                  do {
                    lVar59 = 0;
                    if (uVar58 != 0) {
                      for (; (uVar58 >> lVar59 & 1) == 0; lVar59 = lVar59 + 1) {
                      }
                    }
                    auVar80._8_8_ = 0;
                    auVar80._0_8_ = *(ulong *)(uVar66 + lVar59 * 8);
                    auVar107 = vpunpcklqdq_avx(auVar80,ZEXT416(*(uint *)(local_2540 + lVar59 * 4)));
                    pauVar56[1] = auVar107;
                    pauVar56 = pauVar56 + 1;
                    uVar58 = uVar58 & uVar58 - 1;
                  } while (uVar58 != 0);
                  lVar59 = 0;
                  while (pauVar56 != _local_2690) {
                    auVar107 = _local_2690[1];
                    uVar51 = vextractps_avx(auVar107,2);
                    for (lVar62 = 0x10;
                        (lVar59 != lVar62 && (*(uint *)(_local_2690[-1] + lVar62 + 8) < uVar51));
                        lVar62 = lVar62 + -0x10) {
                      *(undefined1 (*) [16])(*_local_2690 + lVar62) =
                           *(undefined1 (*) [16])(_local_2690[-1] + lVar62);
                    }
                    *(undefined1 (*) [16])(*_local_2690 + lVar62) = auVar107;
                    lVar59 = lVar59 + -0x10;
                    _local_2690 = _local_2690 + 1;
                  }
                  uVar58 = *(ulong *)*pauVar56;
                  pauVar63 = pauVar56;
                }
              }
            }
          }
        }
        lVar59 = (ulong)((uint)uVar58 & 0xf) - 8;
        uVar58 = uVar58 & 0xfffffffffffffff0;
        for (local_25d8 = 0; local_25d8 != lVar59; local_25d8 = local_25d8 + 1) {
          lVar62 = local_25d8 * 0xb0;
          pfVar3 = (float *)(uVar58 + 0x80 + lVar62);
          fVar26 = *pfVar3;
          fVar27 = pfVar3[1];
          fVar28 = pfVar3[2];
          fVar29 = pfVar3[3];
          pfVar3 = (float *)(uVar58 + 0x40 + lVar62);
          fVar30 = *pfVar3;
          fVar31 = pfVar3[1];
          fVar32 = pfVar3[2];
          fVar33 = pfVar3[3];
          auVar69._0_4_ = fVar26 * fVar30;
          auVar69._4_4_ = fVar27 * fVar31;
          auVar69._8_4_ = fVar28 * fVar32;
          auVar69._12_4_ = fVar29 * fVar33;
          pfVar3 = (float *)(uVar58 + 0x70 + lVar62);
          fVar34 = *pfVar3;
          fVar35 = pfVar3[1];
          fVar36 = pfVar3[2];
          fVar37 = pfVar3[3];
          pfVar3 = (float *)(uVar58 + 0x50 + lVar62);
          fVar38 = *pfVar3;
          fVar39 = pfVar3[1];
          fVar40 = pfVar3[2];
          fVar41 = pfVar3[3];
          auVar81._0_4_ = fVar34 * fVar38;
          auVar81._4_4_ = fVar35 * fVar39;
          auVar81._8_4_ = fVar36 * fVar40;
          auVar81._12_4_ = fVar37 * fVar41;
          _local_2690 = vsubps_avx(auVar81,auVar69);
          pfVar3 = (float *)(uVar58 + 0x60 + lVar62);
          fVar42 = *pfVar3;
          fVar43 = pfVar3[1];
          fVar44 = pfVar3[2];
          fVar45 = pfVar3[3];
          auVar82._0_4_ = fVar42 * fVar38;
          auVar82._4_4_ = fVar43 * fVar39;
          auVar82._8_4_ = fVar44 * fVar40;
          auVar82._12_4_ = fVar45 * fVar41;
          pfVar3 = (float *)(uVar58 + 0x30 + lVar62);
          fVar46 = *pfVar3;
          fVar47 = pfVar3[1];
          fVar48 = pfVar3[2];
          fVar49 = pfVar3[3];
          auVar94._0_4_ = fVar26 * fVar46;
          auVar94._4_4_ = fVar27 * fVar47;
          auVar94._8_4_ = fVar28 * fVar48;
          auVar94._12_4_ = fVar29 * fVar49;
          local_2650 = vsubps_avx(auVar94,auVar82);
          auVar95._0_4_ = fVar34 * fVar46;
          auVar95._4_4_ = fVar35 * fVar47;
          auVar95._8_4_ = fVar36 * fVar48;
          auVar95._12_4_ = fVar37 * fVar49;
          auVar139._0_4_ = fVar42 * fVar30;
          auVar139._4_4_ = fVar43 * fVar31;
          auVar139._8_4_ = fVar44 * fVar32;
          auVar139._12_4_ = fVar45 * fVar33;
          auVar92 = vsubps_avx(auVar139,auVar95);
          uVar57 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
          auVar140._4_4_ = uVar57;
          auVar140._0_4_ = uVar57;
          auVar140._8_4_ = uVar57;
          auVar140._12_4_ = uVar57;
          local_25f0 = vsubps_avx(*(undefined1 (*) [16])(uVar58 + lVar62),auVar140);
          uVar57 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
          auVar141._4_4_ = uVar57;
          auVar141._0_4_ = uVar57;
          auVar141._8_4_ = uVar57;
          auVar141._12_4_ = uVar57;
          local_2640 = vsubps_avx(*(undefined1 (*) [16])(uVar58 + 0x10 + lVar62),auVar141);
          uVar57 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
          auVar142._4_4_ = uVar57;
          auVar142._0_4_ = uVar57;
          auVar142._8_4_ = uVar57;
          auVar142._12_4_ = uVar57;
          local_2600 = vsubps_avx(*(undefined1 (*) [16])(uVar58 + 0x20 + lVar62),auVar142);
          fVar68 = (ray->super_RayK<1>).dir.field_0.m128[1];
          fVar75 = (ray->super_RayK<1>).dir.field_0.m128[2];
          fVar77 = local_2600._0_4_;
          auVar145._0_4_ = fVar68 * fVar77;
          fVar11 = local_2600._4_4_;
          auVar145._4_4_ = fVar68 * fVar11;
          fVar14 = local_2600._8_4_;
          auVar145._8_4_ = fVar68 * fVar14;
          fVar17 = local_2600._12_4_;
          auVar145._12_4_ = fVar68 * fVar17;
          fVar131 = local_2640._0_4_;
          auVar147._0_4_ = fVar75 * fVar131;
          fVar12 = local_2640._4_4_;
          auVar147._4_4_ = fVar75 * fVar12;
          fVar15 = local_2640._8_4_;
          auVar147._8_4_ = fVar75 * fVar15;
          fVar18 = local_2640._12_4_;
          auVar147._12_4_ = fVar75 * fVar18;
          auVar78 = vsubps_avx(auVar147,auVar145);
          fVar76 = (ray->super_RayK<1>).dir.field_0.m128[0];
          fVar10 = local_25f0._0_4_;
          auVar70._0_4_ = fVar75 * fVar10;
          fVar13 = local_25f0._4_4_;
          auVar70._4_4_ = fVar75 * fVar13;
          fVar16 = local_25f0._8_4_;
          auVar70._8_4_ = fVar75 * fVar16;
          fVar19 = local_25f0._12_4_;
          auVar70._12_4_ = fVar75 * fVar19;
          auVar83._0_4_ = fVar76 * fVar77;
          auVar83._4_4_ = fVar76 * fVar11;
          auVar83._8_4_ = fVar76 * fVar14;
          auVar83._12_4_ = fVar76 * fVar17;
          auVar110 = vsubps_avx(auVar83,auVar70);
          auVar84._0_4_ = fVar76 * fVar131;
          auVar84._4_4_ = fVar76 * fVar12;
          auVar84._8_4_ = fVar76 * fVar15;
          auVar84._12_4_ = fVar76 * fVar18;
          auVar96._0_4_ = fVar68 * fVar10;
          auVar96._4_4_ = fVar68 * fVar13;
          auVar96._8_4_ = fVar68 * fVar16;
          auVar96._12_4_ = fVar68 * fVar19;
          auVar100 = vsubps_avx(auVar96,auVar84);
          auVar97._0_4_ =
               (float)local_2690 * fVar76 + fVar68 * local_2650._0_4_ + fVar75 * auVar92._0_4_;
          auVar97._4_4_ =
               (float)auStack_268c._0_4_ * fVar76 +
               fVar68 * local_2650._4_4_ + fVar75 * auVar92._4_4_;
          auVar97._8_4_ =
               (float)auStack_268c._4_4_ * fVar76 +
               fVar68 * local_2650._8_4_ + fVar75 * auVar92._8_4_;
          auVar97._12_4_ =
               fStack_2684 * fVar76 + fVar68 * local_2650._12_4_ + fVar75 * auVar92._12_4_;
          auVar85._8_8_ = 0x8000000080000000;
          auVar85._0_8_ = 0x8000000080000000;
          auVar107 = vandps_avx(auVar97,auVar85);
          uVar51 = auVar107._0_4_;
          local_2540._0_4_ =
               (float)(uVar51 ^ (uint)(fVar42 * auVar78._0_4_ +
                                      fVar26 * auVar100._0_4_ + fVar34 * auVar110._0_4_));
          uVar134 = auVar107._4_4_;
          local_2540._4_4_ =
               (float)(uVar134 ^
                      (uint)(fVar43 * auVar78._4_4_ +
                            fVar27 * auVar100._4_4_ + fVar35 * auVar110._4_4_));
          uVar135 = auVar107._8_4_;
          local_2540._8_4_ =
               (float)(uVar135 ^
                      (uint)(fVar44 * auVar78._8_4_ +
                            fVar28 * auVar100._8_4_ + fVar36 * auVar110._8_4_));
          uVar136 = auVar107._12_4_;
          local_2540._12_4_ =
               (float)(uVar136 ^
                      (uint)(fVar45 * auVar78._12_4_ +
                            fVar29 * auVar100._12_4_ + fVar37 * auVar110._12_4_));
          local_2540._16_4_ =
               (float)(uVar51 ^ (uint)(fVar46 * auVar78._0_4_ +
                                      fVar38 * auVar100._0_4_ + fVar30 * auVar110._0_4_));
          local_2540._20_4_ =
               (float)(uVar134 ^
                      (uint)(fVar47 * auVar78._4_4_ +
                            fVar39 * auVar100._4_4_ + fVar31 * auVar110._4_4_));
          local_2540._24_4_ =
               (float)(uVar135 ^
                      (uint)(fVar48 * auVar78._8_4_ +
                            fVar40 * auVar100._8_4_ + fVar32 * auVar110._8_4_));
          local_2540._28_4_ =
               (float)(uVar136 ^
                      (uint)(fVar49 * auVar78._12_4_ +
                            fVar41 * auVar100._12_4_ + fVar33 * auVar110._12_4_));
          auVar110 = ZEXT416(0) << 0x20;
          auVar107 = vcmpps_avx(local_2540._0_16_,auVar110,5);
          auVar78 = vcmpps_avx(local_2540._16_16_,auVar110,5);
          auVar107 = vandps_avx(auVar107,auVar78);
          auVar86._8_4_ = 0x7fffffff;
          auVar86._0_8_ = 0x7fffffff7fffffff;
          auVar86._12_4_ = 0x7fffffff;
          local_2510 = vandps_avx(auVar97,auVar86);
          auVar78 = vcmpps_avx(auVar110,auVar97,4);
          auVar107 = vandps_avx(auVar107,auVar78);
          auVar87._0_4_ = local_2540._0_4_ + local_2540._16_4_;
          auVar87._4_4_ = local_2540._4_4_ + local_2540._20_4_;
          auVar87._8_4_ = local_2540._8_4_ + local_2540._24_4_;
          auVar87._12_4_ = local_2540._12_4_ + local_2540._28_4_;
          auVar78 = vcmpps_avx(auVar87,local_2510,2);
          auVar107 = vandps_avx(auVar107,auVar78);
          auVar20._8_8_ = uStack_2548;
          auVar20._0_8_ = local_2550;
          auVar20 = auVar20 & auVar107;
          if ((((auVar20 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar20 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar20 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar20[0xf] < '\0') {
            auVar50._8_8_ = uStack_2548;
            auVar50._0_8_ = local_2550;
            auVar107 = vandps_avx(auVar107,auVar50);
            local_2520._0_4_ =
                 (float)(uVar51 ^ (uint)((float)local_2690 * fVar10 +
                                        fVar131 * local_2650._0_4_ + fVar77 * auVar92._0_4_));
            local_2520._4_4_ =
                 (float)(uVar134 ^
                        (uint)((float)auStack_268c._0_4_ * fVar13 +
                              fVar12 * local_2650._4_4_ + fVar11 * auVar92._4_4_));
            local_2520._8_4_ =
                 (float)(uVar135 ^
                        (uint)((float)auStack_268c._4_4_ * fVar16 +
                              fVar15 * local_2650._8_4_ + fVar14 * auVar92._8_4_));
            local_2520._12_4_ =
                 (float)(uVar136 ^
                        (uint)(fStack_2684 * fVar19 +
                              fVar18 * local_2650._12_4_ + fVar17 * auVar92._12_4_));
            fVar68 = (ray->super_RayK<1>).org.field_0.m128[3];
            fVar75 = local_2510._0_4_;
            auVar71._0_4_ = fVar75 * fVar68;
            fVar76 = local_2510._4_4_;
            auVar71._4_4_ = fVar76 * fVar68;
            fVar77 = local_2510._8_4_;
            auVar71._8_4_ = fVar77 * fVar68;
            fVar131 = local_2510._12_4_;
            auVar71._12_4_ = fVar131 * fVar68;
            auVar78 = vcmpps_avx(auVar71,local_2520,1);
            fVar68 = (ray->super_RayK<1>).tfar;
            auVar88._0_4_ = fVar75 * fVar68;
            auVar88._4_4_ = fVar76 * fVar68;
            auVar88._8_4_ = fVar77 * fVar68;
            auVar88._12_4_ = fVar131 * fVar68;
            auVar110 = vcmpps_avx(local_2520,auVar88,2);
            auVar78 = vandps_avx(auVar110,auVar78);
            auVar110 = auVar107 & auVar78;
            if ((((auVar110 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar110 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar110 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar110[0xf] < '\0') {
              auVar5._0_4_ = (ray->super_RayK<1>).tfar;
              auVar5._4_4_ = (ray->super_RayK<1>).mask;
              auVar5._8_4_ = (ray->super_RayK<1>).id;
              auVar5._12_4_ = (ray->super_RayK<1>).flags;
              auVar137 = ZEXT1664(auVar5);
              auVar107 = vandps_avx(auVar107,auVar78);
              local_24f0 = auVar107;
              local_24b0[0] = (float)local_2690;
              local_24b0[1] = (float)auStack_268c._0_4_;
              local_24b0[2] = (float)auStack_268c._4_4_;
              local_24b0[3] = fStack_2684;
              local_24a0 = local_2650._0_8_;
              uStack_2498 = local_2650._8_8_;
              local_2670 = auVar92._0_8_;
              uStack_2668 = auVar92._8_8_;
              local_2490 = local_2670;
              uStack_2488 = uStack_2668;
              local_25f0._0_8_ = context->scene;
              local_2630 = auVar107;
              auVar78 = vrcpps_avx(local_2510);
              fVar68 = auVar78._0_4_;
              auVar89._0_4_ = fVar75 * fVar68;
              fVar75 = auVar78._4_4_;
              auVar89._4_4_ = fVar76 * fVar75;
              fVar76 = auVar78._8_4_;
              auVar89._8_4_ = fVar77 * fVar76;
              fVar77 = auVar78._12_4_;
              auVar89._12_4_ = fVar131 * fVar77;
              auVar98._8_4_ = 0x3f800000;
              auVar98._0_8_ = 0x3f8000003f800000;
              auVar98._12_4_ = 0x3f800000;
              auVar78 = vsubps_avx(auVar98,auVar89);
              fVar68 = fVar68 + fVar68 * auVar78._0_4_;
              fVar75 = fVar75 + fVar75 * auVar78._4_4_;
              fVar76 = fVar76 + fVar76 * auVar78._8_4_;
              fVar77 = fVar77 + fVar77 * auVar78._12_4_;
              local_24c0._0_4_ = fVar68 * local_2520._0_4_;
              local_24c0._4_4_ = fVar75 * local_2520._4_4_;
              local_24c0._8_4_ = fVar76 * local_2520._8_4_;
              local_24c0._12_4_ = fVar77 * local_2520._12_4_;
              auVar74 = ZEXT1664(local_24c0);
              local_24e0[0] = fVar68 * local_2540._0_4_;
              local_24e0[1] = fVar75 * local_2540._4_4_;
              local_24e0[2] = fVar76 * local_2540._8_4_;
              local_24e0[3] = fVar77 * local_2540._12_4_;
              local_24d0[0] = fVar68 * local_2540._16_4_;
              local_24d0[1] = fVar75 * local_2540._20_4_;
              local_24d0[2] = fVar76 * local_2540._24_4_;
              local_24d0[3] = fVar77 * local_2540._28_4_;
              auVar72._8_4_ = 0x7f800000;
              auVar72._0_8_ = 0x7f8000007f800000;
              auVar72._12_4_ = 0x7f800000;
              auVar78 = vblendvps_avx(auVar72,local_24c0,auVar107);
              auVar92 = vshufps_avx(auVar78,auVar78,0xb1);
              auVar92 = vminps_avx(auVar92,auVar78);
              auVar110 = vshufpd_avx(auVar92,auVar92,1);
              auVar92 = vminps_avx(auVar110,auVar92);
              auVar78 = vcmpps_avx(auVar78,auVar92,0);
              auVar92 = auVar107 & auVar78;
              if ((((auVar92 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar92 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar92 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar92[0xf] < '\0') {
                auVar107 = vandps_avx(auVar78,auVar107);
              }
              uVar57 = vextractps_avx(auVar5,1);
              local_2690 = (undefined1  [4])uVar57;
              uVar57 = vmovmskps_avx(auVar107);
              uVar66 = CONCAT44((int)((ulong)context->scene >> 0x20),uVar57);
              pbVar60 = (byte *)0x0;
              if (uVar66 != 0) {
                for (; (uVar66 >> (long)pbVar60 & 1) == 0; pbVar60 = pbVar60 + 1) {
                }
              }
              local_2650._0_8_ = lVar62 + uVar58;
              lVar62 = lVar62 + uVar58;
              do {
                local_2570 = auVar137._0_16_;
                local_2588 = *(uint *)(lVar62 + 0x90 + (long)pbVar60 * 4);
                pbVar8 = *(byte **)(*(long *)(local_25f0._0_8_ + 0x1e8) + (ulong)local_2588 * 8);
                if ((*(uint *)(pbVar8 + 0x34) & (uint)local_2690) == 0) {
                  *(undefined4 *)(local_2630 + (long)pbVar60 * 4) = 0;
                  auVar52 = local_2690;
                }
                else {
                  local_2640._0_8_ = pbVar60;
                  local_2600._0_8_ = context->args;
                  local_2560 = auVar74._0_16_;
                  if (context->args->filter == (RTCFilterFunctionN)0x0) {
                    local_25c0 = context->user;
                    if (*(long *)(pbVar8 + 0x40) == 0) {
                      fVar68 = local_24e0[(long)pbVar60];
                      fVar75 = local_24d0[(long)pbVar60];
                      (ray->super_RayK<1>).tfar = *(float *)(local_24c0 + (long)pbVar60 * 4);
                      (ray->Ng).field_0.field_0.x = local_24b0[(long)pbVar60];
                      (ray->Ng).field_0.field_0.y =
                           *(float *)((long)&local_24a0 + (long)pbVar60 * 4);
                      (ray->Ng).field_0.field_0.z =
                           *(float *)((long)&local_2490 + (long)pbVar60 * 4);
                      ray->u = fVar68;
                      ray->v = fVar75;
                      ray->primID = *(uint *)(local_2650._0_8_ + 0xa0 + (long)pbVar60 * 4);
                      ray->geomID = local_2588;
                      ray->instID[0] = local_25c0->instID[0];
                      ray->instPrimID[0] = local_25c0->instPrimID[0];
                      break;
                    }
                    local_2618 = lVar59;
                    local_2610 = uVar64;
                    local_2608 = context;
                  }
                  else {
                    local_2618 = lVar59;
                    local_2610 = uVar64;
                    local_2608 = context;
                    local_25c0 = context->user;
                  }
                  _local_2690 = pauVar63;
                  local_25a0 = local_24b0[(long)pbVar60];
                  local_259c = *(undefined4 *)((long)&local_24a0 + (long)pbVar60 * 4);
                  local_2598 = *(undefined4 *)((long)&local_2490 + (long)pbVar60 * 4);
                  local_2594 = local_24e0[(long)pbVar60];
                  local_2590 = local_24d0[(long)pbVar60];
                  local_258c = *(undefined4 *)(local_2650._0_8_ + 0xa0 + (long)pbVar60 * 4);
                  local_2584 = local_25c0->instID[0];
                  local_2580 = local_25c0->instPrimID[0];
                  (ray->super_RayK<1>).tfar = *(float *)(local_24c0 + (long)pbVar60 * 4);
                  local_2654 = -1;
                  local_25d0 = &local_2654;
                  pbVar60 = *(byte **)(pbVar8 + 0x18);
                  local_25c8 = pbVar60;
                  local_25b8 = ray;
                  local_25b0 = &local_25a0;
                  local_25a8 = 1;
                  local_2618 = lVar59;
                  local_2610 = uVar64;
                  local_2608 = context;
                  if ((*(code **)(pbVar8 + 0x40) == (code *)0x0) ||
                     ((**(code **)(pbVar8 + 0x40))(&local_25d0), *local_25d0 != 0)) {
                    if ((*(code **)(local_2600._0_8_ + 0x10) != (code *)0x0) &&
                       (((pbVar60 = (byte *)local_2600._0_8_, (*(byte *)local_2600._0_8_ & 2) != 0
                         || (pbVar60 = pbVar8, (pbVar8[0x3e] & 0x40) != 0)) &&
                        ((**(code **)(local_2600._0_8_ + 0x10))(&local_25d0), *local_25d0 == 0))))
                    goto LAB_00e7529b;
                    (local_25b8->Ng).field_0.field_0.x = *local_25b0;
                    (local_25b8->Ng).field_0.field_0.y = local_25b0[1];
                    (local_25b8->Ng).field_0.field_0.z = local_25b0[2];
                    local_25b8->u = local_25b0[3];
                    local_25b8->v = local_25b0[4];
                    local_25b8->primID = (uint)local_25b0[5];
                    local_25b8->geomID = (uint)local_25b0[6];
                    local_25b8->instID[0] = (uint)local_25b0[7];
                    pbVar60 = (byte *)0x0;
                    local_25b8->instPrimID[0] = (uint)local_25b0[8];
                  }
                  else {
LAB_00e7529b:
                    (ray->super_RayK<1>).tfar = (float)local_2570._0_4_;
                  }
                  *(undefined4 *)(local_2630 + local_2640._0_8_ * 4) = 0;
                  fVar68 = (ray->super_RayK<1>).tfar;
                  auVar73._4_4_ = fVar68;
                  auVar73._0_4_ = fVar68;
                  auVar73._8_4_ = fVar68;
                  auVar73._12_4_ = fVar68;
                  auVar74 = ZEXT1664(local_2560);
                  auVar107 = vcmpps_avx(local_2560,auVar73,2);
                  local_2630 = vandps_avx(auVar107,local_2630);
                  auVar6._0_4_ = (ray->super_RayK<1>).tfar;
                  auVar6._4_4_ = (ray->super_RayK<1>).mask;
                  auVar6._8_4_ = (ray->super_RayK<1>).id;
                  auVar6._12_4_ = (ray->super_RayK<1>).flags;
                  auVar137 = ZEXT1664(auVar6);
                  auVar52 = (undefined1  [4])vextractps_avx(auVar6,1);
                  context = local_2608;
                  lVar59 = local_2618;
                  uVar64 = local_2610;
                }
                if ((((local_2630 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                     (local_2630 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (local_2630 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    -1 < local_2630[0xf]) break;
                auVar90._8_4_ = 0x7f800000;
                auVar90._0_8_ = 0x7f8000007f800000;
                auVar90._12_4_ = 0x7f800000;
                auVar107 = vblendvps_avx(auVar90,auVar74._0_16_,local_2630);
                auVar78 = vshufps_avx(auVar107,auVar107,0xb1);
                auVar78 = vminps_avx(auVar78,auVar107);
                auVar92 = vshufpd_avx(auVar78,auVar78,1);
                auVar78 = vminps_avx(auVar92,auVar78);
                auVar78 = vcmpps_avx(auVar107,auVar78,0);
                auVar92 = local_2630 & auVar78;
                auVar107 = local_2630;
                if ((((auVar92 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar92 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar92 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar92[0xf] < '\0') {
                  auVar107 = vandps_avx(auVar78,local_2630);
                }
                uVar57 = vmovmskps_avx(auVar107);
                uVar66 = CONCAT44((int)((ulong)pbVar60 >> 0x20),uVar57);
                pbVar60 = (byte *)0x0;
                if (uVar66 != 0) {
                  for (; (uVar66 >> (long)pbVar60 & 1) == 0; pbVar60 = pbVar60 + 1) {
                  }
                }
                local_2690 = auVar52;
                lVar62 = local_2650._0_8_;
              } while( true );
            }
          }
          auVar137 = ZEXT3264(local_23e0);
          auVar138 = ZEXT3264(local_2400);
          auVar143 = ZEXT3264(local_2420);
          auVar144 = ZEXT3264(local_2440);
          auVar146 = ZEXT3264(local_2460);
          auVar148 = ZEXT3264(local_2480);
        }
        fVar68 = (ray->super_RayK<1>).tfar;
        auVar74 = ZEXT3264(CONCAT428(fVar68,CONCAT424(fVar68,CONCAT420(fVar68,CONCAT416(fVar68,
                                                  CONCAT412(fVar68,CONCAT48(fVar68,CONCAT44(fVar68,
                                                  fVar68))))))));
      }
      goto LAB_00e7478e;
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }